

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O3

void __thiscall
testing::internal::ParameterizedTestSuiteInfo<test_libaom::AV1CornerMatch::AV1CornerMatchTest>::
TestInfo::TestInfo(TestInfo *this,char *a_test_suite_base_name,char *a_test_base_name,
                  TestMetaFactoryBase<std::tuple<int,_bool_(*)(const_unsigned_char_*,_int,_int,_int,_double_*,_double_*),_double_(*)(const_unsigned_char_*,_int,_int,_int,_double,_double,_const_unsigned_char_*,_int,_int,_int,_double,_double)>_>
                  *a_test_meta_factory,CodeLocation *a_code_location)

{
  pointer pcVar1;
  allocator local_22;
  allocator local_21;
  
  std::__cxx11::string::string((string *)this,a_test_suite_base_name,&local_21);
  std::__cxx11::string::string((string *)&this->test_base_name,a_test_base_name,&local_22);
  (this->test_meta_factory)._M_t.
  super___uniq_ptr_impl<testing::internal::TestMetaFactoryBase<std::tuple<int,_bool_(*)(const_unsigned_char_*,_int,_int,_int,_double_*,_double_*),_double_(*)(const_unsigned_char_*,_int,_int,_int,_double,_double,_const_unsigned_char_*,_int,_int,_int,_double,_double)>_>,_std::default_delete<testing::internal::TestMetaFactoryBase<std::tuple<int,_bool_(*)(const_unsigned_char_*,_int,_int,_int,_double_*,_double_*),_double_(*)(const_unsigned_char_*,_int,_int,_int,_double,_double,_const_unsigned_char_*,_int,_int,_int,_double,_double)>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_testing::internal::TestMetaFactoryBase<std::tuple<int,_bool_(*)(const_unsigned_char_*,_int,_int,_int,_double_*,_double_*),_double_(*)(const_unsigned_char_*,_int,_int,_int,_double,_double,_const_unsigned_char_*,_int,_int,_int,_double,_double)>_>_*,_std::default_delete<testing::internal::TestMetaFactoryBase<std::tuple<int,_bool_(*)(const_unsigned_char_*,_int,_int,_int,_double_*,_double_*),_double_(*)(const_unsigned_char_*,_int,_int,_int,_double,_double,_const_unsigned_char_*,_int,_int,_int,_double,_double)>_>_>_>
  .
  super__Head_base<0UL,_testing::internal::TestMetaFactoryBase<std::tuple<int,_bool_(*)(const_unsigned_char_*,_int,_int,_int,_double_*,_double_*),_double_(*)(const_unsigned_char_*,_int,_int,_int,_double,_double,_const_unsigned_char_*,_int,_int,_int,_double,_double)>_>_*,_false>
  ._M_head_impl = a_test_meta_factory;
  (this->code_location).file._M_dataplus._M_p = (pointer)&(this->code_location).file.field_2;
  pcVar1 = (a_code_location->file)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->code_location,pcVar1,pcVar1 + (a_code_location->file)._M_string_length
            );
  (this->code_location).line = a_code_location->line;
  return;
}

Assistant:

TestInfo(const char* a_test_suite_base_name, const char* a_test_base_name,
             TestMetaFactoryBase<ParamType>* a_test_meta_factory,
             CodeLocation a_code_location)
        : test_suite_base_name(a_test_suite_base_name),
          test_base_name(a_test_base_name),
          test_meta_factory(a_test_meta_factory),
          code_location(a_code_location) {}